

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall clunk::Node::OutputPV(Node *this,int score,int bound)

{
  int iVar1;
  uint64_t uVar2;
  Output *pOVar3;
  double dVar4;
  char (*local_120) [12];
  int local_114;
  Move local_88 [4];
  char local_61;
  Move *local_60;
  Move *move;
  int i;
  int local_4c;
  int mate;
  int count;
  uint64_t local_30;
  uint64_t nodes;
  Output out;
  uint64_t msecs;
  int bound_local;
  int score_local;
  Node *this_local;
  
  if (0 < this->pvCount) {
    msecs._0_4_ = bound;
    msecs._4_4_ = score;
    _bound_local = this;
    uVar2 = senjo::Now();
    out._vptr_Output = (_func_int **)(uVar2 - _startTime);
    senjo::Output::Output((Output *)&nodes,NoPrefix);
    local_30 = DAT_001aab60 + DAT_001aab68;
    pOVar3 = senjo::Output::operator<<((Output *)&nodes,(char (*) [12])"info depth ");
    pOVar3 = senjo::Output::operator<<(pOVar3,&_depth);
    pOVar3 = senjo::Output::operator<<(pOVar3,(char (*) [11])" seldepth ");
    pOVar3 = senjo::Output::operator<<(pOVar3,&_seldepth);
    pOVar3 = senjo::Output::operator<<(pOVar3,(char (*) [8])" nodes ");
    pOVar3 = senjo::Output::operator<<(pOVar3,&local_30);
    pOVar3 = senjo::Output::operator<<(pOVar3,(char (*) [7])" time ");
    pOVar3 = senjo::Output::operator<<(pOVar3,(unsigned_long *)&out);
    pOVar3 = senjo::Output::operator<<(pOVar3,(char (*) [6])" nps ");
    dVar4 = senjo::Rate(local_30,(uint64_t)out._vptr_Output);
    _mate = (long)dVar4 | (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f;
    senjo::Output::operator<<(pOVar3,(unsigned_long *)&mate);
    if ((int)msecs != 0) {
      pOVar3 = senjo::Output::operator<<((Output *)&nodes,(char (*) [17])" currmovenumber ");
      pOVar3 = senjo::Output::operator<<(pOVar3,&_movenum);
      pOVar3 = senjo::Output::operator<<(pOVar3,(char (*) [11])" currmove ");
      senjo::Output::operator<<
                (pOVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _currmove_abi_cxx11_);
    }
    iVar1 = msecs._4_4_;
    if (msecs._4_4_ < 1) {
      iVar1 = -msecs._4_4_;
    }
    if (iVar1 < 31000) {
      pOVar3 = senjo::Output::operator<<((Output *)&nodes,(char (*) [11])" score cp ");
      senjo::Output::operator<<(pOVar3,(int *)((long)&msecs + 4));
    }
    else {
      iVar1 = -msecs._4_4_;
      if (msecs._4_4_ < 1) {
        iVar1 = msecs._4_4_;
      }
      local_4c = iVar1 + 32000;
      i = (iVar1 + 0x7d01) - (iVar1 + 0x7d01 >> 0x1f) >> 1;
      pOVar3 = senjo::Output::operator<<((Output *)&nodes,(char (*) [13])" score mate ");
      if (msecs._4_4_ < 0) {
        local_114 = -i;
      }
      else {
        local_114 = i;
      }
      move._4_4_ = local_114;
      senjo::Output::operator<<(pOVar3,(int *)((long)&move + 4));
    }
    if ((int)msecs == 0) {
      senjo::Output::operator<<((Output *)&nodes,(char (*) [4])" pv");
      for (move._0_4_ = 0; (int)move < this->pvCount; move._0_4_ = (int)move + 1) {
        local_60 = this->pv + (int)move;
        local_61 = ' ';
        pOVar3 = senjo::Output::operator<<((Output *)&nodes,&local_61);
        Move::ToString_abi_cxx11_(local_88);
        senjo::Output::operator<<
                  (pOVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88);
        std::__cxx11::string::~string((string *)local_88);
      }
    }
    else {
      if ((int)msecs < 0) {
        local_120 = (char (*) [12])0x174428;
      }
      else {
        local_120 = (char (*) [12])0x174434;
      }
      senjo::Output::operator<<((Output *)&nodes,local_120);
    }
    senjo::Output::~Output((Output *)&nodes);
  }
  return;
}

Assistant:

void OutputPV(const int score, const int bound = 0) const {
    if (pvCount > 0) {
      const uint64_t msecs = (senjo::Now() - _startTime);
      senjo::Output out(senjo::Output::NoPrefix);

      const uint64_t nodes = (_stats.snodes + _stats.qnodes);
      out << "info depth " << _depth
          << " seldepth " << _seldepth
          << " nodes " << nodes
          << " time " << msecs
          << " nps " << static_cast<uint64_t>(senjo::Rate(nodes, msecs));

      if (bound) {
        out << " currmovenumber " << _movenum
            << " currmove " << _currmove;
      }

      if (abs(score) < MateScore) {
        out << " score cp " << score;
      }
      else {
        const int count = (Infinity - abs(score));
        const int mate = ((count + 1) / 2);
        out << " score mate " << ((score < 0) ? -mate : mate);
      }

      if (bound) {
        out << ((bound < 0) ? " upperbound" : " lowerbound");
      }
      else {
        out << " pv";
        for (int i = 0; i < pvCount; ++i) {
          const Move& move = pv[i];
          out << ' ' << move.ToString();
        }
      }
    }
  }